

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::StandardColumnData::Checkpoint
          (StandardColumnData *this,RowGroup *row_group,ColumnCheckpointInfo *checkpoint_info)

{
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> _Var2;
  undefined8 uVar3;
  pointer pCVar4;
  type __args;
  StandardColumnCheckpointState *__args_00;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *pvVar5;
  ColumnCheckpointInfo *in_RCX;
  vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> checkpoint_states;
  ColumnDataCheckpointer checkpointer;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> local_160;
  undefined1 local_158 [48];
  LogicalType local_128;
  ColumnDataCheckpointer local_110;
  
  (**(code **)((row_group->super_SegmentBase<duckdb::RowGroup>).start + 0xd8))();
  LogicalType::LogicalType(&local_128,(LogicalType *)&row_group->owned_version_info);
  BaseStatistics::CreateEmpty((BaseStatistics *)&local_110,&local_128);
  BaseStatistics::ToUnique((BaseStatistics *)local_158);
  pCVar4 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                         *)this);
  uVar3 = local_158._0_8_;
  local_158._0_8_ =
       (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
        &pCVar4->global_stats,(pointer)uVar3);
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
              local_158);
  BaseStatistics::~BaseStatistics((BaseStatistics *)&local_110);
  LogicalType::~LogicalType(&local_128);
  make_uniq<duckdb::ColumnCheckpointState,duckdb::RowGroup&,duckdb::ColumnData&,duckdb::PartialBlockManager&>
            ((duckdb *)&local_160,(RowGroup *)checkpoint_info,
             (ColumnData *)
             &row_group[1].columns.
              super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,in_RCX->info->manager);
  LogicalType::LogicalType
            ((LogicalType *)(local_158 + 0x18),
             (LogicalType *)
             &row_group[1].row_group_lock.super___mutex_base._M_mutex.__data.__list.__next);
  BaseStatistics::CreateEmpty((BaseStatistics *)&local_110,(LogicalType *)(local_158 + 0x18));
  BaseStatistics::ToUnique((BaseStatistics *)local_158);
  pCVar4 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                         *)&local_160);
  uVar3 = local_158._0_8_;
  local_158._0_8_ =
       (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
        &pCVar4->global_stats,(pointer)uVar3);
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
              local_158);
  BaseStatistics::~BaseStatistics((BaseStatistics *)&local_110);
  LogicalType::~LogicalType((LogicalType *)(local_158 + 0x18));
  __args = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator*((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                        *)&local_160);
  __args_00 = (StandardColumnCheckpointState *)
              unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
              ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                            *)this);
  _Var2._M_head_impl = local_160._M_head_impl;
  local_160._M_head_impl = (ColumnCheckpointState *)0x0;
  _Var1._M_head_impl =
       (__args_00->validity_state).
       super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
  (__args_00->validity_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (ColumnCheckpointState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnCheckpointState + 8))();
  }
  pvVar5 = SegmentTree<duckdb::ColumnSegment,_false>::ReferenceSegments
                     ((SegmentTree<duckdb::ColumnSegment,_false> *)
                      &(row_group->columns).
                       super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                       .
                       super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  if ((pvVar5->
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ).
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pvVar5->
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ).
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_158._0_8_ =
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)0x0;
    local_158._8_8_ = (element_type *)0x0;
    local_158._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>>>
    ::emplace_back<duckdb::StandardColumnCheckpointState&>
              ((vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>>>
                *)local_158,__args_00);
    ::std::
    vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>>>
    ::emplace_back<duckdb::ColumnCheckpointState&>
              ((vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>>>
                *)local_158,__args);
    ColumnDataCheckpointer::ColumnDataCheckpointer
              (&local_110,
               (vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *)local_158,
               (DatabaseInstance *)
               ((row_group->collection)._M_data)->block_manager[1].blocks._M_h._M_element_count,
               (RowGroup *)checkpoint_info,in_RCX);
    ColumnDataCheckpointer::Checkpoint(&local_110);
    ColumnDataCheckpointer::FinalizeCheckpoint(&local_110);
    ColumnDataCheckpointer::~ColumnDataCheckpointer(&local_110);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                     *)local_158);
  }
  if (local_160._M_head_impl != (ColumnCheckpointState *)0x0) {
    (*(local_160._M_head_impl)->_vptr_ColumnCheckpointState[1])();
  }
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )this;
}

Assistant:

unique_ptr<ColumnCheckpointState> StandardColumnData::Checkpoint(RowGroup &row_group,
                                                                 ColumnCheckpointInfo &checkpoint_info) {
	// we need to checkpoint the main column data first
	// that is because the checkpointing of the main column data ALSO scans the validity data
	// to prevent reading the validity data immediately after it is checkpointed we first checkpoint the main column
	// this is necessary for concurrent checkpointing as due to the partial block manager checkpointed data might be
	// flushed to disk by a different thread than the one that wrote it, causing a data race
	auto base_state = CreateCheckpointState(row_group, checkpoint_info.info.manager);
	base_state->global_stats = BaseStatistics::CreateEmpty(type).ToUnique();
	auto validity_state_p = validity.CreateCheckpointState(row_group, checkpoint_info.info.manager);
	validity_state_p->global_stats = BaseStatistics::CreateEmpty(validity.type).ToUnique();

	auto &validity_state = *validity_state_p;
	auto &checkpoint_state = base_state->Cast<StandardColumnCheckpointState>();
	checkpoint_state.validity_state = std::move(validity_state_p);

	auto &nodes = data.ReferenceSegments();
	if (nodes.empty()) {
		// empty table: flush the empty list
		return base_state;
	}

	vector<reference<ColumnCheckpointState>> checkpoint_states;
	checkpoint_states.emplace_back(checkpoint_state);
	checkpoint_states.emplace_back(validity_state);

	ColumnDataCheckpointer checkpointer(checkpoint_states, GetDatabase(), row_group, checkpoint_info);
	checkpointer.Checkpoint();
	checkpointer.FinalizeCheckpoint();

	return base_state;
}